

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Alias::~Alias(Alias *this)

{
  Alias *this_local;
  
  Orphan<capnp::schema::Brand>::~Orphan(&this->brandOrphan);
  kj::
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  ::~Maybe(&this->target);
  return;
}

Assistant:

Alias(CompiledModule& module, Node& parent, const Expression::Reader& targetName)
      : module(module), parent(parent), targetName(targetName) {}